

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O3

void __thiscall FIX::SessionState::clearQueue(SessionState *this)

{
  int iVar1;
  
  Mutex::lock(&this->m_mutex);
  std::
  _Rb_tree<int,_std::pair<const_int,_FIX::Message>,_std::_Select1st<std::pair<const_int,_FIX::Message>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::Message>_>_>
  ::clear(&(this->m_queue)._M_t);
  iVar1 = (this->m_mutex).m_count;
  (this->m_mutex).m_count = iVar1 + -1;
  if (1 < iVar1) {
    return;
  }
  (this->m_mutex).m_threadID = 0;
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  return;
}

Assistant:

void clearQueue()
  { Locker l( m_mutex ); m_queue.clear(); }